

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_link_page_element_into_freelist(nk_context *ctx,nk_page_element *elem)

{
  nk_page_element *elem_local;
  nk_context *ctx_local;
  
  if (ctx->freelist == (nk_page_element *)0x0) {
    ctx->freelist = elem;
  }
  else {
    elem->next = ctx->freelist;
    ctx->freelist = elem;
  }
  return;
}

Assistant:

NK_LIB void
nk_link_page_element_into_freelist(struct nk_context *ctx,
    struct nk_page_element *elem)
{
    /* link table into freelist */
    if (!ctx->freelist) {
        ctx->freelist = elem;
    } else {
        elem->next = ctx->freelist;
        ctx->freelist = elem;
    }
}